

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateInterface
          (ServiceGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->vars_)._M_t);
  Formatter::operator()<>
            (&local_50,
             "class $dllexport_decl $$classname$ : public ::$proto_ns$::Service {\n protected:\n  // This class should be treated as an abstract interface.\n  inline $classname$() {};\n public:\n  virtual ~$classname$();\n"
            );
  io::Printer::Indent(printer);
  Formatter::operator()<>
            (&local_50,
             "\ntypedef $classname$_Stub Stub;\n\nstatic const ::$proto_ns$::ServiceDescriptor* descriptor();\n\n"
            );
  GenerateMethodSignatures(this,VIRTUAL,printer);
  Formatter::operator()<>
            (&local_50,
             "\n// implements Service ----------------------------------------------\n\nconst ::$proto_ns$::ServiceDescriptor* GetDescriptor();\nvoid CallMethod(const ::$proto_ns$::MethodDescriptor* method,\n                ::$proto_ns$::RpcController* controller,\n                const ::$proto_ns$::Message* request,\n                ::$proto_ns$::Message* response,\n                ::google::protobuf::Closure* done);\nconst ::$proto_ns$::Message& GetRequestPrototype(\n  const ::$proto_ns$::MethodDescriptor* method) const;\nconst ::$proto_ns$::Message& GetResponsePrototype(\n  const ::$proto_ns$::MethodDescriptor* method) const;\n"
            );
  io::Printer::Outdent(printer);
  Formatter::operator()<>
            (&local_50,"\n private:\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n};\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void ServiceGenerator::GenerateInterface(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "class $dllexport_decl $$classname$ : public ::$proto_ns$::Service {\n"
      " protected:\n"
      "  // This class should be treated as an abstract interface.\n"
      "  inline $classname$() {};\n"
      " public:\n"
      "  virtual ~$classname$();\n");
  printer->Indent();

  format(
      "\n"
      "typedef $classname$_Stub Stub;\n"
      "\n"
      "static const ::$proto_ns$::ServiceDescriptor* descriptor();\n"
      "\n");

  GenerateMethodSignatures(VIRTUAL, printer);

  format(
      "\n"
      "// implements Service ----------------------------------------------\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* GetDescriptor();\n"
      "void CallMethod(const ::$proto_ns$::MethodDescriptor* method,\n"
      "                ::$proto_ns$::RpcController* controller,\n"
      "                const ::$proto_ns$::Message* request,\n"
      "                ::$proto_ns$::Message* response,\n"
      "                ::google::protobuf::Closure* done);\n"
      "const ::$proto_ns$::Message& GetRequestPrototype(\n"
      "  const ::$proto_ns$::MethodDescriptor* method) const;\n"
      "const ::$proto_ns$::Message& GetResponsePrototype(\n"
      "  const ::$proto_ns$::MethodDescriptor* method) const;\n");

  printer->Outdent();
  format(
      "\n"
      " private:\n"
      "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n"
      "};\n"
      "\n");
}